

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

int lua_gc(lua_State *L,int what,...)

{
  lu_byte lVar1;
  global_State *g;
  uint in_ECX;
  uint in_EDX;
  uint uVar2;
  int newmode;
  uint uVar3;
  long debt;
  bool bVar4;
  va_list argp;
  uint local_c0;
  int local_b8;
  
  g = L->l_G;
  if ((g->gcstp & 2) != 0) {
    return -1;
  }
  uVar3 = 0xffffffff;
  switch(what) {
  case 0:
    g->gcstp = '\x01';
LAB_001081b6:
    uVar3 = 0;
    break;
  case 1:
    uVar3 = 0;
    luaE_setdebt(g,0);
    g->gcstp = '\0';
    break;
  case 2:
    uVar3 = 0;
    luaC_fullgc(L,0);
    break;
  case 3:
    uVar3 = (uint)((ulong)(g->GCdebt + g->totalbytes) >> 10);
    break;
  case 4:
    uVar3 = (int)g->GCdebt + (int)g->totalbytes & 0x3ff;
    break;
  case 5:
    lVar1 = g->gcstp;
    g->gcstp = '\0';
    if ((long)(int)in_EDX == 0) {
      luaE_setdebt(g,0);
      luaC_step(L);
      g->gcstp = lVar1;
    }
    else {
      debt = (long)(int)in_EDX * 0x400 + g->GCdebt;
      luaE_setdebt(g,debt);
      if (0 < L->l_G->GCdebt) {
        luaC_step(L);
      }
      g->gcstp = lVar1;
      if (debt < 1) goto LAB_001081b6;
    }
    bVar4 = g->gcstate == '\b';
    goto LAB_001084ac;
  case 6:
    uVar3 = (uint)g->gcpause << 2;
    uVar2 = in_EDX + 3;
    if (-1 < (int)in_EDX) {
      uVar2 = in_EDX;
    }
    g->gcpause = (lu_byte)(uVar2 >> 2);
    break;
  case 7:
    uVar3 = (uint)g->gcstepmul << 2;
    uVar2 = in_EDX + 3;
    if (-1 < (int)in_EDX) {
      uVar2 = in_EDX;
    }
    g->gcstepmul = (lu_byte)(uVar2 >> 2);
    break;
  case 9:
    bVar4 = g->gcstp == '\0';
LAB_001084ac:
    uVar3 = (uint)bVar4;
    break;
  case 10:
    uVar3 = 10;
    if (g->gckind != '\x01') {
      uVar3 = (g->lastatomic == 0) + 10;
    }
    if (in_EDX != 0) {
      g->genminormul = (lu_byte)in_EDX;
    }
    if (local_c0 != 0) {
      uVar2 = local_c0 + 3;
      if (-1 < (int)local_c0) {
        uVar2 = local_c0;
      }
      g->genmajormul = (lu_byte)(uVar2 >> 2);
    }
    newmode = 1;
    goto LAB_00108488;
  case 0xb:
    uVar3 = 10;
    if (g->gckind != '\x01') {
      uVar3 = (g->lastatomic == 0) + 10;
    }
    if (in_EDX != 0) {
      uVar2 = in_EDX + 3;
      if (-1 < (int)in_EDX) {
        uVar2 = in_EDX;
      }
      g->gcpause = (lu_byte)(uVar2 >> 2);
    }
    if (in_ECX != 0) {
      uVar2 = in_ECX + 3;
      if (-1 < (int)in_ECX) {
        uVar2 = in_ECX;
      }
      g->gcstepmul = (lu_byte)(uVar2 >> 2);
    }
    if (local_b8 != 0) {
      g->gcstepsize = (lu_byte)local_b8;
    }
    newmode = 0;
LAB_00108488:
    luaC_changemode(L,newmode);
  }
  return uVar3;
}

Assistant:

LUA_API int lua_gc (lua_State *L, int what, ...) {
  va_list argp;
  int res = 0;
  global_State *g = G(L);
  if (g->gcstp & GCSTPGC)  /* internal stop? */
    return -1;  /* all options are invalid when stopped */
  lua_lock(L);
  va_start(argp, what);
  switch (what) {
    case LUA_GCSTOP: {
      g->gcstp = GCSTPUSR;  /* stopped by the user */
      break;
    }
    case LUA_GCRESTART: {
      luaE_setdebt(g, 0);
      g->gcstp = 0;  /* (GCSTPGC must be already zero here) */
      break;
    }
    case LUA_GCCOLLECT: {
      luaC_fullgc(L, 0);
      break;
    }
    case LUA_GCCOUNT: {
      /* GC values are expressed in Kbytes: #bytes/2^10 */
      res = cast_int(gettotalbytes(g) >> 10);
      break;
    }
    case LUA_GCCOUNTB: {
      res = cast_int(gettotalbytes(g) & 0x3ff);
      break;
    }
    case LUA_GCSTEP: {
      int data = va_arg(argp, int);
      l_mem debt = 1;  /* =1 to signal that it did an actual step */
      lu_byte oldstp = g->gcstp;
      g->gcstp = 0;  /* allow GC to run (GCSTPGC must be zero here) */
      if (data == 0) {
        luaE_setdebt(g, 0);  /* do a basic step */
        luaC_step(L);
      }
      else {  /* add 'data' to total debt */
        debt = cast(l_mem, data) * 1024 + g->GCdebt;
        luaE_setdebt(g, debt);
        luaC_checkGC(L);
      }
      g->gcstp = oldstp;  /* restore previous state */
      if (debt > 0 && g->gcstate == GCSpause)  /* end of cycle? */
        res = 1;  /* signal it */
      break;
    }
    case LUA_GCSETPAUSE: {
      int data = va_arg(argp, int);
      res = getgcparam(g->gcpause);
      setgcparam(g->gcpause, data);
      break;
    }
    case LUA_GCSETSTEPMUL: {
      int data = va_arg(argp, int);
      res = getgcparam(g->gcstepmul);
      setgcparam(g->gcstepmul, data);
      break;
    }
    case LUA_GCISRUNNING: {
      res = gcrunning(g);
      break;
    }
    case LUA_GCGEN: {
      int minormul = va_arg(argp, int);
      int majormul = va_arg(argp, int);
      res = isdecGCmodegen(g) ? LUA_GCGEN : LUA_GCINC;
      if (minormul != 0)
        g->genminormul = minormul;
      if (majormul != 0)
        setgcparam(g->genmajormul, majormul);
      luaC_changemode(L, KGC_GEN);
      break;
    }
    case LUA_GCINC: {
      int pause = va_arg(argp, int);
      int stepmul = va_arg(argp, int);
      int stepsize = va_arg(argp, int);
      res = isdecGCmodegen(g) ? LUA_GCGEN : LUA_GCINC;
      if (pause != 0)
        setgcparam(g->gcpause, pause);
      if (stepmul != 0)
        setgcparam(g->gcstepmul, stepmul);
      if (stepsize != 0)
        g->gcstepsize = stepsize;
      luaC_changemode(L, KGC_INC);
      break;
    }
    default: res = -1;  /* invalid option */
  }
  va_end(argp);
  lua_unlock(L);
  return res;
}